

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O1

nng_err nni_aio_set_iov(nni_aio *aio,uint nio,nni_iov *iov)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  nng_err nVar4;
  long lVar5;
  
  nVar4 = NNG_EINVAL;
  if (nio < 9) {
    if (nio != 0 && aio->a_iov != iov) {
      lVar5 = 0;
      do {
        puVar1 = (undefined8 *)((long)&iov->iov_buf + lVar5);
        uVar3 = puVar1[1];
        puVar2 = (undefined8 *)((long)&aio->a_iov[0].iov_buf + lVar5);
        *puVar2 = *puVar1;
        puVar2[1] = uVar3;
        lVar5 = lVar5 + 0x10;
      } while ((ulong)nio << 4 != lVar5);
    }
    aio->a_nio = nio;
    nVar4 = NNG_OK;
  }
  return nVar4;
}

Assistant:

nng_err
nni_aio_set_iov(nni_aio *aio, unsigned nio, const nni_iov *iov)
{

	if (nio > NNI_NUM_ELEMENTS((aio->a_iov))) {
		return (NNG_EINVAL);
	}

	// Sometimes we are resubmitting our own io vector, with
	// just a smaller count.  We copy them only if we are not.
	if (iov != &aio->a_iov[0]) {
		for (unsigned i = 0; i < nio; i++) {
			aio->a_iov[i] = iov[i];
		}
	}
	aio->a_nio = nio;
	return (NNG_OK);
}